

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klogic.h
# Opt level: O2

cmplx klogic::activation(int k,cmplx *z)

{
  undefined1 auVar1 [16];
  uint n;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  double dVar2;
  cmplx cVar3;
  
  if (k != 0) {
    n = sector_number(k,z);
    cVar3 = epsilon(n,k);
    return (cmplx)cVar3._M_value;
  }
  dVar2 = std::abs<double>(z);
  auVar1._8_8_ = dVar2;
  auVar1._0_8_ = dVar2;
  divpd(*(undefined1 (*) [16])z->_M_value,auVar1);
  cVar3._M_value._8_8_ = extraout_RDX;
  cVar3._M_value._0_8_ = extraout_RAX;
  return (cmplx)cVar3._M_value;
}

Assistant:

inline cmplx activation(int k, const cmplx &z) {
        if (k == 0)
            return z / std::abs(z);
        else {
            return epsilon(sector_number(k, z), k);
        }
    }